

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  ImDrawList *pIVar4;
  ImDrawVert *pIVar5;
  unsigned_short *puVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  ImDrawVert *pIVar9;
  unsigned_short *__dest;
  ulong uVar10;
  ulong uVar11;
  int rhs_size;
  long lVar12;
  uint uVar13;
  int iVar14;
  ImVector<ImDrawVert> new_vtx_buffer;
  ImVector<ImDrawVert> local_48;
  
  local_48.Size = 0;
  local_48.Capacity = 0;
  local_48.Data = (ImDrawVert *)0x0;
  this->TotalVtxCount = 0;
  this->TotalIdxCount = 0;
  if (0 < this->CmdListsCount) {
    lVar12 = 0;
    do {
      pIVar8 = GImGui;
      pIVar4 = this->CmdLists[lVar12];
      uVar3 = (pIVar4->IdxBuffer).Size;
      if (uVar3 != 0) {
        if (local_48.Capacity < (int)uVar3) {
          if (local_48.Capacity == 0) {
            uVar13 = 8;
          }
          else {
            uVar13 = local_48.Capacity / 2 + local_48.Capacity;
          }
          if ((int)uVar13 <= (int)uVar3) {
            uVar13 = uVar3;
          }
          if (local_48.Capacity < (int)uVar13) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + 1;
            pIVar9 = (ImDrawVert *)(*(pIVar8->IO).MemAllocFn)((long)(int)uVar13 * 0x14);
            if (local_48.Data != (ImDrawVert *)0x0) {
              memcpy(pIVar9,local_48.Data,(long)local_48.Size * 0x14);
            }
            if (local_48.Data != (ImDrawVert *)0x0) {
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + -1;
            }
            (*(GImGui->IO).MemFreeFn)(local_48.Data);
            local_48._0_8_ = (ulong)uVar13 << 0x20;
            local_48.Data = pIVar9;
          }
        }
        iVar14 = local_48.Capacity;
        local_48.Size = uVar3;
        if (0 < (pIVar4->IdxBuffer).Size) {
          uVar10 = 0;
          if (0 < (int)uVar3) {
            uVar10 = (ulong)uVar3;
          }
          uVar11 = 0;
          pIVar9 = local_48.Data;
          do {
            uVar2 = (pIVar4->IdxBuffer).Data[uVar11];
            if (((pIVar4->VtxBuffer).Size <= (int)(uint)uVar2) || (uVar10 == uVar11)) {
              __assert_fail("i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                            ,0x353,
                            "value_type &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
            }
            pIVar5 = (pIVar4->VtxBuffer).Data;
            pIVar9->col = pIVar5[uVar2].col;
            pIVar5 = pIVar5 + uVar2;
            IVar7 = pIVar5->uv;
            pIVar9->pos = pIVar5->pos;
            pIVar9->uv = IVar7;
            uVar11 = uVar11 + 1;
            pIVar9 = pIVar9 + 1;
          } while ((long)uVar11 < (long)(pIVar4->IdxBuffer).Size);
        }
        local_48.Size = (pIVar4->VtxBuffer).Size;
        (pIVar4->VtxBuffer).Size = uVar3;
        local_48.Capacity = (pIVar4->VtxBuffer).Capacity;
        (pIVar4->VtxBuffer).Capacity = iVar14;
        pIVar9 = (pIVar4->VtxBuffer).Data;
        (pIVar4->VtxBuffer).Data = local_48.Data;
        pIVar8 = GImGui;
        iVar14 = (pIVar4->IdxBuffer).Capacity;
        local_48.Data = pIVar9;
        if (iVar14 < 0) {
          iVar14 = iVar14 / 2 + iVar14;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          __dest = (unsigned_short *)(*(pIVar8->IO).MemAllocFn)((ulong)(uint)(iVar14 * 2));
          puVar6 = (pIVar4->IdxBuffer).Data;
          if (puVar6 != (unsigned_short *)0x0) {
            memcpy(__dest,puVar6,(long)(pIVar4->IdxBuffer).Size * 2);
          }
          puVar6 = (pIVar4->IdxBuffer).Data;
          if (puVar6 != (unsigned_short *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(puVar6);
          (pIVar4->IdxBuffer).Data = __dest;
          (pIVar4->IdxBuffer).Capacity = iVar14;
        }
        (pIVar4->IdxBuffer).Size = 0;
        this->TotalVtxCount = this->TotalVtxCount + (pIVar4->VtxBuffer).Size;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->CmdListsCount);
  }
  ImVector<ImDrawVert>::~ImVector(&local_48);
  return;
}

Assistant:

void ImDrawList::AddQuad(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col, float thickness)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathStroke(col, true, thickness);
}